

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Learn.cpp
# Opt level: O0

int __thiscall Qclass::plot(Qclass *this)

{
  ostream *poVar1;
  GnuplotException *ge;
  string local_198;
  allocator local_171;
  string local_170;
  allocator local_149;
  string local_148;
  allocator local_121;
  string local_120;
  allocator local_f9;
  string local_f8;
  allocator local_d1;
  string local_d0;
  allocator local_99;
  string local_98;
  undefined1 local_78 [8];
  Gnuplot g1;
  Qclass *this_local;
  
  g1.tmpfile_list.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_98,"lines",&local_99);
  Gnuplot::Gnuplot((Gnuplot *)local_78,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  Gnuplot::set_xrange((Gnuplot *)local_78,-10.0,60.0);
  Gnuplot::set_yrange((Gnuplot *)local_78,-10.0,60.0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d0,"Co_ordinates.txt",&local_d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f8,"Path",&local_f9);
  Gnuplot::plotfile_xy((Gnuplot *)local_78,&local_d0,1,2,&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_120,"Obstacles1.txt",&local_121);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_148,"Obstacles",&local_149);
  Gnuplot::plotfile_xy((Gnuplot *)local_78,&local_120,1,2,&local_148);
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator((allocator<char> *)&local_149);
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator((allocator<char> *)&local_121);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_170,"Obstacles2.txt",&local_171);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_198,"Obstacles",(allocator *)((long)&ge + 7));
  Gnuplot::plotfile_xy((Gnuplot *)local_78,&local_170,1,2,&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator((allocator<char> *)((long)&ge + 7));
  std::__cxx11::string::~string((string *)&local_170);
  std::allocator<char>::~allocator((allocator<char> *)&local_171);
  poVar1 = (ostream *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"Press ENTER to continue...");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ios::clear((long)&std::cin + *(long *)(std::cin + -0x18),0);
  std::ios::rdbuf();
  std::streambuf::in_avail();
  std::istream::ignore((long)&std::cin);
  std::istream::get();
  Gnuplot::~Gnuplot((Gnuplot *)local_78);
  return 0;
}

Assistant:

int Qclass::plot() {
  try {
    Gnuplot g1("lines");
    // Plots points present in Text files
    g1.set_xrange(-10, 60);
    g1.set_yrange(-10, 60);
    g1.plotfile_xy("Co_ordinates.txt", 1, 2, "Path");
    g1.plotfile_xy("Obstacles1.txt", 1, 2, "Obstacles");
    g1.plotfile_xy("Obstacles2.txt", 1, 2, "Obstacles");

#if defined(unix) || defined(__unix) || defined(__unix__) || defined(__APPLE__)
    std::cout << std::endl << "Press ENTER to continue..." << std::endl;

    std::cin.clear();
    std::cin.ignore(std::cin.rdbuf()->in_avail());
    std::cin.get();
#endif
  } catch (GnuplotException& ge) {
    // std::cout << ge.what() << std::endl;
  }
  return 0;
}